

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  LargeHeapBucket *pLVar4;
  undefined6 in_register_0000000a;
  LargeHeapBucket *pLVar5;
  LargeHeapBlockFreeList *pLVar6;
  undefined8 *in_FS_OFFSET;
  
  if (0x3ff < (uint)CONCAT62(in_register_0000000a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x178,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  pLVar6 = this->freeList;
  do {
    if (pLVar6 == (LargeHeapBlockFreeList *)0x0) {
      return (char *)0x0;
    }
    pLVar4 = (LargeHeapBucket *)
             LargeHeapBlock::TryAllocFromFreeList(pLVar6->heapBlock,sizeCat,attributes);
    pLVar5 = pLVar4;
    if (pLVar4 == (LargeHeapBucket *)0x0) {
      if ((recycler->recyclerFlagsTable->Verbose == true) &&
         ((bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase)
          , bVar3 ||
          (bVar3 = Js::Phases::IsEnabled
                             (&recycler->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase),
          bVar3)))) {
        Output::Print(L"Unable to allocate object of size 0x%x from freelist\n",sizeCat);
      }
      pLVar6 = pLVar6->next;
      pLVar5 = this;
    }
    this = pLVar5;
  } while (pLVar4 == (LargeHeapBucket *)0x0);
  return (char *)pLVar5;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeList* freeListEntry = this->freeList;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        char * memBlock = heapBlock->TryAllocFromFreeList(sizeCat, attributes);
        if (memBlock)
        {
            // Don't need to verify zero fill here since we will do it in LargeHeapBucket::Alloc
            return memBlock;
        }
        else
        {
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Unable to allocate object of size 0x%x from freelist\n"), sizeCat);
#endif
        }

        freeListEntry = freeListEntry->next;
    }
    return nullptr;
}